

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xml2_read_toc(archive_read *a)

{
  uint *puVar1;
  void *pvVar2;
  xmlattr *pxVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  enctype eVar7;
  long lVar8;
  char *pcVar9;
  xmlattr *pxVar10;
  char *pcVar11;
  archive_string *as;
  long lVar12;
  time_t tVar13;
  size_t sVar14;
  size_t sVar15;
  long lVar16;
  uint *l;
  xar_file *pxVar17;
  uint uVar18;
  uint uVar19;
  size_t sVar20;
  xar *pxVar21;
  bool bVar22;
  xmlattr_list list;
  xmlattr local_60;
  xar_file *local_48;
  char *local_40;
  int local_34;
  
  lVar8 = xmlReaderForIO(xml2_read_cb,xml2_close_cb,a,0,0,0);
  if (lVar8 == 0) {
    archive_set_error(&a->archive,0xc,"Couldn\'t allocate memory for xml parser");
    local_60.value._4_4_ = -0x1e;
  }
  else {
    xmlTextReaderSetErrorHandler(lVar8,xml2_error_hdr,a);
    do {
      iVar5 = xmlTextReaderRead(lVar8);
      if (iVar5 != 1) {
        xmlFreeTextReader(lVar8);
        xmlCleanupParser();
        if (iVar5 != 0) {
          return -0x1e;
        }
        return 0;
      }
      iVar5 = xmlTextReaderNodeType(lVar8);
      pcVar9 = (char *)xmlTextReaderConstLocalName(lVar8);
      bVar4 = true;
      if (iVar5 == 0xf) goto LAB_001502c2;
      if (iVar5 != 3) {
        if (iVar5 != 1) goto LAB_001502cd;
        iVar6 = xmlTextReaderIsEmptyElement(lVar8);
        local_60.next = (xmlattr *)0x0;
        local_60.name = (char *)&local_60;
        iVar5 = xmlTextReaderMoveToFirstAttribute(lVar8);
        local_34 = iVar6;
        while (iVar5 == 1) {
          pxVar10 = (xmlattr *)malloc(0x18);
          if (pxVar10 == (xmlattr *)0x0) {
LAB_001501ed:
            archive_set_error(&a->archive,0xc,"Out of memory");
            iVar5 = -0x1e;
            break;
          }
          pcVar11 = (char *)xmlTextReaderConstLocalName(lVar8);
          pcVar11 = strdup(pcVar11);
          pxVar10->name = pcVar11;
          if (pcVar11 == (char *)0x0) {
LAB_001501e5:
            free(pxVar10);
            goto LAB_001501ed;
          }
          pcVar11 = (char *)xmlTextReaderConstValue(lVar8);
          pcVar11 = strdup(pcVar11);
          pxVar10->value = pcVar11;
          if (pcVar11 == (char *)0x0) {
            free(pxVar10->name);
            goto LAB_001501e5;
          }
          pxVar10->next = (xmlattr *)0x0;
          *(xmlattr **)local_60.name = pxVar10;
          local_60.name = (char *)pxVar10;
          iVar5 = xmlTextReaderMoveToNextAttribute(lVar8);
        }
        pxVar10 = local_60.next;
        if (iVar5 != 0) goto joined_r0x0015025e;
        pxVar21 = (xar *)a->format->data;
        pxVar21->base64text = 0;
        switch(pxVar21->xmlsts) {
        case INIT:
          iVar5 = strcmp(pcVar9,"xar");
          if (iVar5 != 0) goto switchD_00150239_caseD_3;
          pxVar21->xmlsts = XAR;
          break;
        case XAR:
          iVar5 = strcmp(pcVar9,"toc");
          if (iVar5 != 0) goto switchD_00150239_caseD_3;
          pxVar21->xmlsts = TOC;
          break;
        case TOC:
          iVar5 = strcmp(pcVar9,"creation-time");
          if (iVar5 == 0) {
            pxVar21->xmlsts = TOC_CREATION_TIME;
          }
          else {
            iVar5 = strcmp(pcVar9,"checksum");
            if (iVar5 == 0) {
              pxVar21->xmlsts = TOC_CHECKSUM;
            }
            else {
              iVar5 = strcmp(pcVar9,"file");
              if (iVar5 != 0) goto switchD_00150239_caseD_3;
              iVar6 = file_new(a,pxVar21,(xmlattr_list *)&local_60);
              iVar5 = -0x1e;
              pxVar10 = local_60.next;
              if (iVar6 != 0) goto joined_r0x0015025e;
              pxVar21->xmlsts = TOC_FILE;
            }
          }
          break;
        case TOC_CREATION_TIME:
        case TOC_CHECKSUM_OFFSET:
        case TOC_CHECKSUM_SIZE:
        case FILE_DATA_LENGTH:
        case FILE_DATA_OFFSET:
        case FILE_DATA_SIZE:
        case FILE_DATA_ENCODING:
        case FILE_DATA_A_CHECKSUM:
        case FILE_DATA_E_CHECKSUM:
        case FILE_DATA_CONTENT:
        case FILE_EA_LENGTH:
        case FILE_EA_OFFSET:
        case FILE_EA_SIZE:
        case FILE_EA_ENCODING:
        case FILE_EA_A_CHECKSUM:
        case FILE_EA_E_CHECKSUM:
        case FILE_EA_NAME:
        case FILE_EA_FSTYPE:
        case FILE_CTIME:
        case FILE_MTIME:
        case FILE_ATIME:
        case FILE_GROUP:
        case FILE_GID:
        case FILE_USER:
        case FILE_UID:
        case FILE_MODE:
        case FILE_DEVICE_MAJOR:
        case FILE_DEVICE_MINOR:
        case FILE_DEVICENO:
        case FILE_INODE:
        case FILE_LINK:
        case FILE_TYPE:
        case FILE_NAME:
        case FILE_ACL_DEFAULT:
        case FILE_ACL_ACCESS:
        case FILE_ACL_APPLEEXTENDED:
        case FILE_FLAGS_USER_NODUMP:
        case FILE_FLAGS_USER_IMMUTABLE:
        case FILE_FLAGS_USER_APPEND:
        case FILE_FLAGS_USER_OPAQUE:
        case FILE_FLAGS_USER_NOUNLINK:
        case FILE_FLAGS_SYS_ARCHIVED:
        case FILE_FLAGS_SYS_IMMUTABLE:
        case FILE_FLAGS_SYS_APPEND:
        case FILE_FLAGS_SYS_NOUNLINK:
        case FILE_FLAGS_SYS_SNAPSHOT:
        case FILE_EXT2_SecureDeletion:
        case FILE_EXT2_Undelete:
        case FILE_EXT2_Compress:
        case FILE_EXT2_Synchronous:
        case FILE_EXT2_Immutable:
        case FILE_EXT2_AppendOnly:
        case FILE_EXT2_NoDump:
        case FILE_EXT2_NoAtime:
        case FILE_EXT2_CompDirty:
        case FILE_EXT2_CompBlock:
        case FILE_EXT2_NoCompBlock:
        case FILE_EXT2_CompError:
        case FILE_EXT2_BTree:
        case FILE_EXT2_HashIndexed:
        case FILE_EXT2_iMagic:
        case FILE_EXT2_Journaled:
        case FILE_EXT2_NoTail:
        case FILE_EXT2_DirSync:
        case FILE_EXT2_TopDir:
        case FILE_EXT2_Reserved:
        case UNKNOWN:
          goto switchD_00150239_caseD_3;
        case TOC_CHECKSUM:
          iVar5 = strcmp(pcVar9,"offset");
          if (iVar5 == 0) {
            pxVar21->xmlsts = TOC_CHECKSUM_OFFSET;
          }
          else {
            iVar5 = strcmp(pcVar9,"size");
            if (iVar5 != 0) goto switchD_00150239_caseD_3;
            pxVar21->xmlsts = TOC_CHECKSUM_SIZE;
          }
          break;
        case TOC_FILE:
          iVar5 = strcmp(pcVar9,"file");
          if (iVar5 != 0) {
            iVar5 = strcmp(pcVar9,"data");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_DATA;
              break;
            }
            iVar5 = strcmp(pcVar9,"ea");
            if (iVar5 == 0) {
              iVar6 = xattr_new(a,pxVar21,(xmlattr_list *)&local_60);
              iVar5 = -0x1e;
              pxVar10 = local_60.next;
              if (iVar6 != 0) goto joined_r0x0015025e;
              pxVar21->xmlsts = FILE_EA;
              break;
            }
            iVar5 = strcmp(pcVar9,"ctime");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_CTIME;
              break;
            }
            iVar5 = strcmp(pcVar9,"mtime");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_MTIME;
              break;
            }
            iVar5 = strcmp(pcVar9,"atime");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_ATIME;
              break;
            }
            iVar5 = strcmp(pcVar9,"group");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_GROUP;
              break;
            }
            iVar5 = strcmp(pcVar9,"gid");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_GID;
              break;
            }
            iVar5 = strcmp(pcVar9,"user");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_USER;
              break;
            }
            iVar5 = strcmp(pcVar9,"uid");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_UID;
              break;
            }
            iVar5 = strcmp(pcVar9,"mode");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_MODE;
              break;
            }
            iVar5 = strcmp(pcVar9,"device");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_DEVICE;
              break;
            }
            iVar5 = strcmp(pcVar9,"deviceno");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_DEVICENO;
              break;
            }
            iVar5 = strcmp(pcVar9,"inode");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_INODE;
              break;
            }
            iVar5 = strcmp(pcVar9,"link");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_LINK;
              break;
            }
            iVar5 = strcmp(pcVar9,"type");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_TYPE;
              for (pxVar10 = local_60.next; pxVar10 != (xmlattr *)0x0; pxVar10 = pxVar10->next) {
                iVar5 = strcmp(pxVar10->name,"link");
                if (iVar5 == 0) {
                  local_48 = pxVar21->file;
                  if (((local_48->hdnext != (xar_file *)0x0) || (local_48->link != 0)) ||
                     (pxVar17 = pxVar21->hdlink_orgs, local_48 == pxVar17)) {
                    archive_set_error(&a->archive,-1,"File with multiple link attributes");
LAB_00151466:
                    iVar5 = -0x1e;
                    pxVar10 = local_60.next;
                    goto joined_r0x0015025e;
                  }
                  local_40 = pxVar10->value;
                  iVar5 = strcmp(local_40,"original");
                  if (iVar5 == 0) {
                    local_48->hdnext = pxVar17;
                    pxVar21->hdlink_orgs = local_48;
                  }
                  else {
                    sVar15 = strlen(local_40);
                    uVar19 = 0;
                    if ((sVar15 != 0) && (uVar18 = (int)*local_40 - 0x30, uVar18 < 10)) {
                      uVar19 = 0;
                      sVar20 = 1;
                      do {
                        uVar19 = uVar18 + uVar19 * 10;
                        uVar18 = (int)local_40[sVar20] - 0x30;
                        if (9 < uVar18) break;
                        bVar22 = sVar15 != sVar20;
                        sVar20 = sVar20 + 1;
                      } while (bVar22);
                    }
                    local_48->link = uVar19;
                    if ((uVar19 != 0) && (iVar5 = add_link(a,pxVar21,local_48), iVar5 != 0))
                    goto LAB_00151466;
                  }
                }
              }
              break;
            }
            iVar5 = strcmp(pcVar9,"name");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_NAME;
              for (pxVar10 = local_60.next; pxVar10 != (xmlattr *)0x0; pxVar10 = pxVar10->next) {
                iVar5 = strcmp(pxVar10->name,"enctype");
                if ((iVar5 == 0) && (iVar5 = strcmp(pxVar10->value,"base64"), iVar5 == 0)) {
                  pxVar21->base64text = 1;
                }
              }
              break;
            }
            iVar5 = strcmp(pcVar9,"acl");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_ACL;
              break;
            }
            iVar5 = strcmp(pcVar9,"flags");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_FLAGS;
              break;
            }
            iVar5 = strcmp(pcVar9,"ext2");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_EXT2;
              break;
            }
            goto LAB_0015023e;
          }
          iVar6 = file_new(a,pxVar21,(xmlattr_list *)&local_60);
          goto LAB_00150249;
        case FILE_DATA:
          iVar5 = strcmp(pcVar9,"length");
          if (iVar5 == 0) {
            pxVar21->xmlsts = FILE_DATA_LENGTH;
          }
          else {
            iVar5 = strcmp(pcVar9,"offset");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_DATA_OFFSET;
            }
            else {
              iVar5 = strcmp(pcVar9,"size");
              if (iVar5 == 0) {
                pxVar21->xmlsts = FILE_DATA_SIZE;
              }
              else {
                iVar5 = strcmp(pcVar9,"encoding");
                if (iVar5 == 0) {
                  pxVar21->xmlsts = FILE_DATA_ENCODING;
                  eVar7 = getencoding((xmlattr_list *)&local_60);
                  pxVar17 = pxVar21->file;
LAB_001511c8:
                  pxVar17->encoding = eVar7;
                }
                else {
                  iVar5 = strcmp(pcVar9,"archived-checksum");
                  if (iVar5 == 0) {
                    pxVar21->xmlsts = FILE_DATA_A_CHECKSUM;
                    iVar5 = getsumalgorithm((xmlattr_list *)&local_60);
                    (pxVar21->file->a_sum).alg = iVar5;
                  }
                  else {
                    iVar5 = strcmp(pcVar9,"extracted-checksum");
                    if (iVar5 == 0) {
                      pxVar21->xmlsts = FILE_DATA_E_CHECKSUM;
                      iVar5 = getsumalgorithm((xmlattr_list *)&local_60);
                      (pxVar21->file->e_sum).alg = iVar5;
                    }
                    else {
                      iVar5 = strcmp(pcVar9,"content");
                      if (iVar5 != 0) goto switchD_00150239_caseD_3;
                      pxVar21->xmlsts = FILE_DATA_CONTENT;
                    }
                  }
                }
              }
            }
          }
          break;
        case FILE_EA:
          iVar5 = strcmp(pcVar9,"length");
          if (iVar5 == 0) {
            pxVar21->xmlsts = FILE_EA_LENGTH;
          }
          else {
            iVar5 = strcmp(pcVar9,"offset");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_EA_OFFSET;
            }
            else {
              iVar5 = strcmp(pcVar9,"size");
              if (iVar5 == 0) {
                pxVar21->xmlsts = FILE_EA_SIZE;
              }
              else {
                iVar5 = strcmp(pcVar9,"encoding");
                if (iVar5 == 0) {
                  pxVar21->xmlsts = FILE_EA_ENCODING;
                  eVar7 = getencoding((xmlattr_list *)&local_60);
                  pxVar17 = (xar_file *)pxVar21->xattr;
                  goto LAB_001511c8;
                }
                iVar5 = strcmp(pcVar9,"archived-checksum");
                if (iVar5 == 0) {
                  pxVar21->xmlsts = FILE_EA_A_CHECKSUM;
                }
                else {
                  iVar5 = strcmp(pcVar9,"extracted-checksum");
                  if (iVar5 == 0) {
                    pxVar21->xmlsts = FILE_EA_E_CHECKSUM;
                  }
                  else {
                    iVar5 = strcmp(pcVar9,"name");
                    if (iVar5 == 0) {
                      pxVar21->xmlsts = FILE_EA_NAME;
                    }
                    else {
                      iVar5 = strcmp(pcVar9,"fstype");
                      if (iVar5 != 0) goto switchD_00150239_caseD_3;
                      pxVar21->xmlsts = FILE_EA_FSTYPE;
                    }
                  }
                }
              }
            }
          }
          break;
        case FILE_DEVICE:
          iVar5 = strcmp(pcVar9,"major");
          if (iVar5 == 0) {
            pxVar21->xmlsts = FILE_DEVICE_MAJOR;
          }
          else {
            iVar5 = strcmp(pcVar9,"minor");
            if (iVar5 != 0) goto switchD_00150239_caseD_3;
            pxVar21->xmlsts = FILE_DEVICE_MINOR;
          }
          break;
        case FILE_ACL:
          iVar5 = strcmp(pcVar9,"appleextended");
          if (iVar5 == 0) {
            pxVar21->xmlsts = FILE_ACL_APPLEEXTENDED;
          }
          else {
            iVar5 = strcmp(pcVar9,"default");
            if (iVar5 == 0) {
              pxVar21->xmlsts = FILE_ACL_DEFAULT;
            }
            else {
              iVar5 = strcmp(pcVar9,"access");
              if (iVar5 != 0) goto switchD_00150239_caseD_3;
              pxVar21->xmlsts = FILE_ACL_ACCESS;
            }
          }
          break;
        case FILE_FLAGS:
          iVar5 = xml_parse_file_flags(pxVar21,pcVar9);
          goto LAB_0015109e;
        case FILE_EXT2:
          iVar5 = xml_parse_file_ext2(pxVar21,pcVar9);
LAB_0015109e:
          if (iVar5 != 0) break;
switchD_00150239_caseD_3:
LAB_0015023e:
          iVar6 = unknowntag_start(a,pxVar21,pcVar9);
LAB_00150249:
          iVar5 = -0x1e;
          pxVar10 = local_60.next;
          if (iVar6 == 0) break;
          goto joined_r0x0015025e;
        }
        iVar5 = 0;
        pxVar10 = local_60.next;
joined_r0x0015025e:
        while (pxVar10 != (xmlattr *)0x0) {
          pxVar3 = pxVar10->next;
          free(pxVar10->name);
          free(pxVar10->value);
          free(pxVar10);
          pxVar10 = pxVar3;
        }
        local_60.next = (xmlattr *)0x0;
        local_60.name = (char *)&local_60;
        if (iVar5 != 0) {
          xmlFreeTextReader(lVar8);
          xmlCleanupParser();
          bVar4 = false;
          local_60.value._4_4_ = iVar5;
          goto switchD_001501d0_caseD_c;
        }
        if (local_34 != 0) {
LAB_001502c2:
          xml_end(a,pcVar9);
        }
        goto LAB_001502cd;
      }
      as = (archive_string *)xmlTextReaderConstValue(lVar8);
      pcVar9 = (char *)strlen((char *)as);
      pvVar2 = a->format->data;
      iVar5 = *(int *)((long)pvVar2 + 0x28);
      if (iVar5 == 6) {
        lVar16 = 0x58;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
LAB_0015019f:
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
LAB_001501a1:
        *(long *)((long)pvVar2 + lVar16) = lVar12;
      }
      else if (iVar5 == 5) {
        lVar16 = 0x50;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19))
        goto LAB_0015019f;
        lVar12 = 0;
        pcVar11 = (char *)0x1;
        do {
          lVar12 = (ulong)uVar19 + lVar12 * 10;
          uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
          if (9 < uVar19) break;
          bVar22 = pcVar9 != pcVar11;
          pcVar11 = pcVar11 + 1;
        } while (bVar22);
        goto LAB_001501a1;
      }
      lVar16 = *(long *)((long)pvVar2 + 0x1a0);
      if (lVar16 == 0) goto switchD_001501d0_caseD_c;
      l = &switchD_001501d0::switchdataD_0018bce4;
      switch(iVar5) {
      case 9:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 1;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x28) = lVar12;
        break;
      case 10:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 1;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x30) = lVar12;
        break;
      case 0xb:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 1;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x38) = lVar12;
        break;
      case 0xd:
        sVar14 = atohex((uchar *)(lVar16 + 0x58),(size_t)as,pcVar9,0x18bce4);
        lVar16 = *(long *)((long)pvVar2 + 0x1a0);
        goto LAB_0015084e;
      case 0xe:
        sVar14 = atohex((uchar *)(lVar16 + 0x80),(size_t)as,pcVar9,0x18bce4);
        lVar16 = *(long *)((long)pvVar2 + 0x1a0);
        goto LAB_00150823;
      case 0x11:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar16 = 0;
        }
        else {
          lVar16 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar16 = (ulong)uVar19 + lVar16 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(*(long *)((long)pvVar2 + 0x1a8) + 0x28) = lVar16;
        break;
      case 0x12:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar16 = 0;
        }
        else {
          lVar16 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar16 = (ulong)uVar19 + lVar16 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(*(long *)((long)pvVar2 + 0x1a8) + 0x30) = lVar16;
        break;
      case 0x13:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar16 = 0;
        }
        else {
          lVar16 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar16 = (ulong)uVar19 + lVar16 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(*(long *)((long)pvVar2 + 0x1a8) + 0x38) = lVar16;
        break;
      case 0x15:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        sVar14 = atohex((uchar *)(*(long *)((long)pvVar2 + 0x1a8) + 0x58),(size_t)as,pcVar9,0x18bce4
                       );
        lVar16 = *(long *)((long)pvVar2 + 0x1a8);
LAB_0015084e:
        *(size_t *)(lVar16 + 0x50) = sVar14;
        break;
      case 0x16:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        sVar14 = atohex((uchar *)(*(long *)((long)pvVar2 + 0x1a8) + 0x80),(size_t)as,pcVar9,0x18bce4
                       );
        lVar16 = *(long *)((long)pvVar2 + 0x1a8);
LAB_00150823:
        *(size_t *)(lVar16 + 0x78) = sVar14;
        break;
      case 0x17:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        lVar16 = *(long *)((long)pvVar2 + 0x1a8);
        *(undefined8 *)(lVar16 + 0x10) = 0;
        pxVar21 = (xar *)(lVar16 + 8);
        goto LAB_00150871;
      case 0x18:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x20;
        lVar16 = *(long *)((long)pvVar2 + 0x1a8);
        *(undefined8 *)(lVar16 + 0xa0) = 0;
        pxVar21 = (xar *)(lVar16 + 0x98);
        goto LAB_00150871;
      case 0x19:
        *(uint *)(lVar16 + 0x1c) = *(uint *)(lVar16 + 0x1c) | 0x8008;
        tVar13 = parse_time((char *)as,(size_t)pcVar9);
        *(time_t *)(*(long *)((long)pvVar2 + 0x1a0) + 200) = tVar13;
        break;
      case 0x1a:
        *(uint *)(lVar16 + 0x1c) = *(uint *)(lVar16 + 0x1c) | 0x10008;
        tVar13 = parse_time((char *)as,(size_t)pcVar9);
        *(time_t *)(*(long *)((long)pvVar2 + 0x1a0) + 0xd0) = tVar13;
        break;
      case 0x1b:
        *(uint *)(lVar16 + 0x1c) = *(uint *)(lVar16 + 0x1c) | 0x20008;
        tVar13 = parse_time((char *)as,(size_t)pcVar9);
        *(time_t *)(*(long *)((long)pvVar2 + 0x1a0) + 0xd8) = tVar13;
        break;
      case 0x1c:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 0x20;
        *(undefined8 *)(lVar16 + 0x108) = 0;
        pxVar21 = (xar *)(lVar16 + 0x100);
        goto LAB_00150871;
      case 0x1d:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 0x20;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x118) = lVar12;
        break;
      case 0x1e:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 0x10;
        *(undefined8 *)(lVar16 + 0xe8) = 0;
        pxVar21 = (xar *)(lVar16 + 0xe0);
        goto LAB_00150871;
      case 0x1f:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 0x10;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0xf8) = lVar12;
        break;
      case 0x20:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 0x40;
        if (pcVar9 == (char *)0x0) {
          uVar19 = 0;
        }
        else {
          pcVar11 = (char *)0x0;
          uVar19 = 0;
          do {
            if ((pcVar11[(long)&as->s] & 0xf8U) != 0x30) break;
            uVar19 = (uint)(byte)(pcVar11[(long)&as->s] - 0x30) + uVar19 * 8;
            pcVar11 = pcVar11 + 1;
          } while (pcVar9 != pcVar11);
          uVar19 = uVar19 & 0xffff0fff;
        }
        *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xf000 | uVar19;
        break;
      case 0x22:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 2;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x130) = lVar12;
        break;
      case 0x23:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 4;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x138) = lVar12;
        break;
      case 0x24:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 1;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x128) = lVar12;
        break;
      case 0x25:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 8;
        if ((pcVar9 == (char *)0x0) || (uVar19 = (int)*(char *)&as->s - 0x30, 9 < uVar19)) {
          lVar12 = 0;
        }
        else {
          lVar12 = 0;
          pcVar11 = (char *)0x1;
          do {
            lVar12 = (ulong)uVar19 + lVar12 * 10;
            uVar19 = (int)pcVar11[(long)&as->s] - 0x30;
            if (9 < uVar19) break;
            bVar22 = pcVar9 != pcVar11;
            pcVar11 = pcVar11 + 1;
          } while (bVar22);
        }
        *(long *)(lVar16 + 0x140) = lVar12;
        break;
      case 0x26:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 4;
        *(undefined8 *)(lVar16 + 0xb8) = 0;
        pxVar21 = (xar *)(lVar16 + 0xb0);
LAB_00150871:
        archive_strncat((archive_string *)pxVar21,as,(size_t)pcVar9);
        break;
      case 0x27:
        if ((pcVar9 != (char *)0x4) || (iVar5 = bcmp(as,"file",4), iVar5 != 0)) {
          switch(pcVar9) {
          case (char *)0x4:
            goto switchD_001503bc_caseD_4;
          case (char *)0x6:
            goto switchD_001503bc_caseD_6;
          case (char *)0x7:
            goto switchD_001503bc_caseD_7;
          case (char *)0x8:
            iVar5 = bcmp(as,"hardlink",(size_t)pcVar9);
            if (iVar5 == 0) goto LAB_001503d4;
            goto LAB_001503ec;
          case (char *)0x9:
            goto switchD_001503bc_caseD_9;
          case (char *)0xd:
            goto switchD_001503bc_caseD_d;
          case (char *)0x11:
            goto switchD_001503bc_caseD_11;
          }
          goto switchD_001503bc_caseD_5;
        }
LAB_001503d4:
        *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0x8000;
LAB_001503ec:
        switch(pcVar9) {
        case (char *)0x4:
          goto switchD_001503bc_caseD_4;
        case (char *)0x6:
          goto switchD_001503bc_caseD_6;
        case (char *)0x7:
switchD_001503bc_caseD_7:
          iVar5 = bcmp(as,"symlink",(size_t)pcVar9);
          if (iVar5 == 0) {
            *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0xa000;
          }
          if (0xc < (long)pcVar9) {
            if (pcVar9 != (char *)0xd) goto switchD_00150452_default;
            goto switchD_001503bc_caseD_d;
          }
          goto LAB_0015050e;
        case (char *)0x9:
switchD_001503bc_caseD_9:
          iVar5 = bcmp(as,"directory",(size_t)pcVar9);
          if (iVar5 == 0) {
            *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0x4000;
          }
          switch(pcVar9) {
          case (char *)0x4:
            goto switchD_001503bc_caseD_4;
          case (char *)0x5:
          case (char *)0x8:
          case (char *)0x9:
          case (char *)0xa:
          case (char *)0xb:
          case (char *)0xc:
            break;
          case (char *)0x6:
            goto switchD_001503bc_caseD_6;
          case (char *)0x7:
            goto switchD_001503bc_caseD_7;
          case (char *)0xd:
            goto switchD_001503bc_caseD_d;
          default:
switchD_00150452_default:
            if (pcVar9 == (char *)0x11) goto switchD_001503bc_caseD_11;
          }
          break;
        case (char *)0xd:
switchD_001503bc_caseD_d:
          iVar5 = bcmp(as,"block special",(size_t)pcVar9);
          if (iVar5 == 0) {
            *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0x6000;
          }
LAB_0015050e:
          if (pcVar9 == (char *)0x4) {
switchD_001503bc_caseD_4:
            iVar5 = bcmp(as,"fifo",(size_t)pcVar9);
            if (iVar5 == 0) {
              *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0x1000;
            }
          }
          else if (pcVar9 == (char *)0x6) {
switchD_001503bc_caseD_6:
            iVar5 = bcmp(as,"socket",(size_t)pcVar9);
            if (iVar5 == 0) {
              *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0xc000;
            }
            if (pcVar9 == (char *)0x4) goto switchD_001503bc_caseD_4;
          }
          break;
        case (char *)0x11:
switchD_001503bc_caseD_11:
          iVar5 = bcmp(as,"character special",(size_t)pcVar9);
          if (iVar5 == 0) {
            *(uint *)(lVar16 + 0x120) = *(uint *)(lVar16 + 0x120) & 0xffff0fff | 0x2000;
          }
          if (pcVar9 == (char *)0x4) goto switchD_001503bc_caseD_4;
          if (pcVar9 == (char *)0x6) goto switchD_001503bc_caseD_6;
          if (pcVar9 == (char *)0xd) goto switchD_001503bc_caseD_d;
        }
switchD_001503bc_caseD_5:
        *(byte *)(lVar16 + 0x1c) = *(byte *)(lVar16 + 0x1c) | 0x80;
        break;
      case 0x28:
        if ((*(byte *)(lVar16 + 0x1c) & 2) == 0) {
          if (*(long *)(lVar16 + 0x10) != 0) {
            archive_string_concat
                      ((archive_string *)(lVar16 + 0x98),
                       (archive_string *)(*(long *)(lVar16 + 0x10) + 0x98));
            archive_strappend_char((archive_string *)(*(long *)((long)pvVar2 + 0x1a0) + 0x98),'/');
          }
          lVar16 = *(long *)((long)pvVar2 + 0x1a0);
          puVar1 = (uint *)(lVar16 + 0x1c);
          *puVar1 = *puVar1 | 2;
          pxVar21 = (xar *)(lVar16 + 0x98);
          if (*(int *)((long)pvVar2 + 0x38) == 0) goto LAB_00150871;
          strappend_base64(pxVar21,as,pcVar9,(size_t)l);
        }
        break;
      case 0x2a:
      case 0x2b:
      case 0x2c:
        *(byte *)(lVar16 + 0x1d) = *(byte *)(lVar16 + 0x1d) | 0x40;
      }
switchD_001501d0_caseD_c:
LAB_001502cd:
    } while (bVar4);
  }
  return local_60.value._4_4_;
}

Assistant:

static int
xml2_read_toc(struct archive_read *a)
{
	xmlTextReaderPtr reader;
	struct xmlattr_list list;
	int r;

	reader = xmlReaderForIO(xml2_read_cb, xml2_close_cb, a, NULL, NULL, 0);
	if (reader == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Couldn't allocate memory for xml parser");
		return (ARCHIVE_FATAL);
	}
	xmlTextReaderSetErrorHandler(reader, xml2_error_hdr, a);

	while ((r = xmlTextReaderRead(reader)) == 1) {
		const char *name, *value;
		int type, empty;

		type = xmlTextReaderNodeType(reader);
		name = (const char *)xmlTextReaderConstLocalName(reader);
		switch (type) {
		case XML_READER_TYPE_ELEMENT:
			empty = xmlTextReaderIsEmptyElement(reader);
			r = xml2_xmlattr_setup(a, &list, reader);
			if (r == ARCHIVE_OK)
				r = xml_start(a, name, &list);
			xmlattr_cleanup(&list);
			if (r != ARCHIVE_OK) {
				xmlFreeTextReader(reader);
				xmlCleanupParser();
				return (r);
			}
			if (empty)
				xml_end(a, name);
			break;
		case XML_READER_TYPE_END_ELEMENT:
			xml_end(a, name);
			break;
		case XML_READER_TYPE_TEXT:
			value = (const char *)xmlTextReaderConstValue(reader);
			xml_data(a, value, strlen(value));
			break;
		case XML_READER_TYPE_SIGNIFICANT_WHITESPACE:
		default:
			break;
		}
		if (r < 0)
			break;
	}
	xmlFreeTextReader(reader);
	xmlCleanupParser();

	return ((r == 0)?ARCHIVE_OK:ARCHIVE_FATAL);
}